

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
          (NonAnsiPortListBuilder *this,ValueSymbol *symbol,DeclaratorSyntax *decl,
          DataTypeSyntax *dataType,PortInfo *info)

{
  undefined1 *puVar1;
  Symbol *pSVar2;
  ValueSymbol *local_30;
  
  (symbol->super_Symbol).originatingSyntax = &decl->super_SyntaxNode;
  Symbol::setAttributes(&symbol->super_Symbol,this->scope,info->attrs);
  local_30 = symbol;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
  emplace_back<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
            ((SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
             this->implicitMembers,&local_30,&info->insertionPoint);
  info->internalSymbol = &symbol->super_Symbol;
  if (dataType == (DataTypeSyntax *)0x0) {
    if ((decl->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
        _M_extent_value == 0) goto LAB_0037c6da;
  }
  else {
    (symbol->declaredType).typeOrLink.typeSyntax = dataType;
    puVar1 = &(symbol->declaredType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
  }
  DeclaredType::setDimensionSyntax(&symbol->declaredType,&decl->dimensions);
LAB_0037c6da:
  pSVar2 = info->insertionPoint;
  if (pSVar2 != (Symbol *)0x0) {
    *(SymbolIndex *)&(symbol->declaredType).field_0x3c =
         *(SymbolIndex *)&(symbol->declaredType).field_0x3c & 0xc0000000 |
         pSVar2->indexInScope & 0x3fffffff;
  }
  return;
}

Assistant:

void setInternalSymbol(ValueSymbol& symbol, const DeclaratorSyntax& decl,
                           const DataTypeSyntax* dataType, PortInfo& info) {
        symbol.setSyntax(decl);
        symbol.setAttributes(scope, info.attrs);
        implicitMembers.emplace_back(&symbol, info.insertionPoint);
        info.internalSymbol = &symbol;

        if (dataType)
            symbol.setDeclaredType(*dataType, decl.dimensions);
        else if (!decl.dimensions.empty())
            symbol.getDeclaredType()->setDimensionSyntax(decl.dimensions);

        if (info.insertionPoint)
            symbol.getDeclaredType()->setOverrideIndex(info.insertionPoint->getIndex());
    }